

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O1

void __thiscall
re2c::Node::cover<unsigned_int,unsigned_int>
          (Node *this,path_t *prefix,FILE *input,FILE *keys,covers_t *size)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  uint uVar3;
  rule_t rVar4;
  pointer ppvVar5;
  pointer ppvVar6;
  pointer puVar7;
  pointer puVar8;
  bool bVar9;
  path_t *ppVar10;
  _Rb_tree_node_base *p_Var11;
  void *pvVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong count;
  ulong uVar16;
  ulong len;
  size_t buffer_size;
  uint m;
  path_t local_68;
  
  bVar9 = end(this);
  if ((bVar9) && (this->suffix == (path_t *)0x0)) {
    ppVar10 = (path_t *)operator_new(0x38);
    rVar4 = this->rule;
    bVar9 = this->ctx;
    (ppVar10->arcs).
    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ppVar10->arcs).
    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ppVar10->arcs).
    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppVar10->rule = rVar4;
    ppVar10->rule_pos = 0;
    ppVar10->ctx = bVar9;
    ppVar10->ctx_pos = 0;
    this->suffix = ppVar10;
  }
  if (this->suffix == (path_t *)0x0) {
    if (this->loop < 2) {
      this->loop = this->loop + 1;
      p_Var11 = (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->arcs)._M_t._M_impl.super__Rb_tree_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) && (size->value != 0x40000000)) {
        do {
          std::
          vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ::vector(&local_68.arcs,&prefix->arcs);
          local_68.rule = prefix->rule;
          local_68.rule_pos = prefix->rule_pos;
          local_68.ctx = prefix->ctx;
          local_68._41_7_ = *(undefined7 *)&prefix->field_0x29;
          local_68.ctx_pos = prefix->ctx_pos;
          path_t::extend(&local_68,*(rule_t *)(*(long *)(p_Var11 + 1) + 100),
                         *(bool *)(*(long *)(p_Var11 + 1) + 0x6c),(arc_t *)&p_Var11[1]._M_parent);
          cover<unsigned_int,unsigned_int>(*(Node **)(p_Var11 + 1),&local_68,input,keys,size);
          if ((*(long *)(*(long *)(p_Var11 + 1) + 0xa8) != 0) && (this->suffix == (path_t *)0x0)) {
            ppVar10 = (path_t *)operator_new(0x38);
            rVar4 = this->rule;
            bVar9 = this->ctx;
            (ppVar10->arcs).
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (ppVar10->arcs).
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (ppVar10->arcs).
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ppVar10->rule = rVar4;
            ppVar10->rule_pos = 0;
            ppVar10->ctx = bVar9;
            ppVar10->ctx_pos = 0;
            this->suffix = ppVar10;
            path_t::extend(ppVar10,*(rule_t *)(*(long *)(p_Var11 + 1) + 100),
                           *(bool *)(*(long *)(p_Var11 + 1) + 0x6c),(arc_t *)&p_Var11[1]._M_parent);
            path_t::append(this->suffix,*(path_t **)(*(long *)(p_Var11 + 1) + 0xa8));
          }
          pvVar12 = (void *)CONCAT44(local_68.arcs.
                                     super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_68.arcs.
                                     super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_);
          if (pvVar12 != (void *)0x0) {
            operator_delete(pvVar12,(long)local_68.arcs.
                                          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)pvVar12);
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (((_Rb_tree_header *)p_Var11 != p_Var1) && (size->value != 0x40000000));
      }
      this->loop = this->loop + 0xff;
    }
  }
  else {
    path_t::append(prefix,this->suffix);
    ppvVar5 = (prefix->arcs).
              super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppvVar6 = (prefix->arcs).
              super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    len = (long)ppvVar6 - (long)ppvVar5 >> 3;
    uVar2 = size->value;
    if (ppvVar6 == ppvVar5) {
      count = 0;
    }
    else {
      lVar13 = 0;
      count = 0;
      do {
        uVar16 = (long)(ppvVar5[lVar13]->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(ppvVar5[lVar13]->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        if (uVar16 < count) {
          uVar16 = count;
        }
        count = uVar16;
        lVar13 = lVar13 + 1;
      } while (len + (len == 0) != lVar13);
    }
    uVar16 = 0x40000000;
    if (len < 0x40000000) {
      uVar16 = len;
    }
    uVar14 = 0x40000000;
    if (count < 0x40000000) {
      uVar14 = count;
    }
    uVar14 = uVar14 * uVar16;
    uVar16 = 0x40000000;
    if (uVar14 < 0x40000000) {
      pvVar12 = operator_new__(uVar14 * 4);
      if (ppvVar6 != ppvVar5) {
        lVar13 = 0;
        do {
          if (count != 0) {
            puVar7 = (ppvVar5[lVar13]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            puVar8 = (ppvVar5[lVar13]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            uVar16 = 0;
            do {
              uVar3 = puVar7[uVar16 % (ulong)((long)puVar8 - (long)puVar7 >> 2)];
              lVar15 = 0;
              ppVar10 = &local_68;
              do {
                *(char *)&(ppVar10->arcs).
                          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                     (char)(uVar3 >> ((byte)lVar15 & 0x1f));
                lVar15 = lVar15 + 8;
                ppVar10 = (path_t *)
                          ((long)&(ppVar10->arcs).
                                  super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
              } while (lVar15 != 0x20);
              *(undefined4 *)((long)pvVar12 + uVar16 * len * 4 + lVar13 * 4) =
                   local_68.arcs.
                   super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              uVar16 = uVar16 + 1;
            } while (uVar16 != count);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != len + (len == 0));
      }
      fwrite(pvVar12,4,uVar14,(FILE *)input);
      operator_delete__(pvVar12);
      keygen<unsigned_int>
                (keys,count,len,(&prefix->rule_pos)[(ulong)(prefix->rule).restorectx * 2],
                 (rule_rank_t)(prefix->rule).rank.value);
      uVar16 = uVar14;
    }
    uVar16 = uVar16 + uVar2;
    if (0x3fffffff < uVar16) {
      uVar16 = 0x40000000;
    }
    size->value = (uint32_t)uVar16;
  }
  return;
}

Assistant:

void Node::cover (path_t & prefix, FILE * input, FILE * keys, covers_t &size)
{
	if (end () && suffix == NULL)
	{
		suffix = new path_t (rule, ctx);
	}
	if (suffix != NULL)
	{
		prefix.append (suffix);
		size = size + cover_one<cunit_t, key_t> (input, keys, prefix);
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin ();
			i != arcs.end () && !size.overflow(); ++i)
		{
			path_t new_prefix = prefix;
			new_prefix.extend (i->first->rule, i->first->ctx, &i->second);
			i->first->cover<cunit_t, key_t> (new_prefix, input, keys, size);
			if (i->first->suffix != NULL && suffix == NULL)
			{
				suffix = new path_t (rule, ctx);
				suffix->extend (i->first->rule, i->first->ctx, &i->second);
				suffix->append (i->first->suffix);
			}
		}
	}
}